

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O0

void skiwi::inline_is_procedure(asmcode *code,compiler_options *param_2)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  operation local_114 [2];
  operand local_10c [2];
  operation local_104 [4];
  operand local_f4 [2];
  operation local_ec;
  unsigned_long local_e8;
  operand local_dc [2];
  operation local_d4 [4];
  operand local_c4 [2];
  operation local_bc [3];
  operand local_b0 [2];
  operation local_a8 [2];
  operand local_a0 [2];
  operation local_98;
  operand local_94 [2];
  operation local_8c;
  undefined1 local_88 [8];
  string lab_false;
  undefined1 local_58 [8];
  string check_closure;
  string done;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&check_closure.field_2 + 8),psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_58,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_88,psVar1,lab_00);
  local_8c = MOV;
  local_94[1] = 10;
  local_94[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_8c,local_94 + 1,local_94);
  local_98 = AND;
  local_a0[1] = 10;
  local_a0[0] = NUMBER;
  local_a8[1] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_98,local_a0 + 1,local_a0,(int *)(local_a8 + 1));
  local_a8[0] = CMP;
  local_b0[1] = 10;
  local_b0[0] = NUMBER;
  local_bc[2] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_a8,local_b0 + 1,local_b0,(int *)(local_bc + 2));
  local_bc[1] = 0x3d;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_bc + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_bc[0] = MOV;
  local_c4[1] = 9;
  local_c4[0] = NUMBER;
  local_d4[3] = 0xf;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_bc,local_c4 + 1,local_c4,(int *)(local_d4 + 3));
  local_d4[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_d4 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&check_closure.field_2 + 8));
  local_d4[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_d4 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  jump_short_if_arg_is_not_block(code,RAX,RBX,(string *)local_88);
  local_d4[0] = AND;
  local_dc[1] = 9;
  local_dc[0] = NUMBER;
  local_e8 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_d4,local_dc + 1,local_dc,&local_e8);
  jump_short_if_arg_does_not_point_to_closure(code,RAX,RAX,(string *)local_88);
  local_ec = MOV;
  local_f4[1] = 9;
  local_f4[0] = NUMBER;
  local_104[3] = 0xf;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_ec,local_f4 + 1,local_f4,(int *)(local_104 + 3));
  local_104[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_104 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&check_closure.field_2 + 8));
  local_104[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_104 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  local_104[0] = MOV;
  local_10c[1] = 9;
  local_10c[0] = NUMBER;
  local_114[1] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_104,local_10c + 1,local_10c,(int *)(local_114 + 1));
  local_114[0] = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_114,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&check_closure.field_2 + 8));
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(check_closure.field_2._M_local_buf + 8));
  return;
}

Assistant:

void inline_is_procedure(ASM::asmcode& code, const compiler_options&)
  {
  auto done = label_to_string(label++);
  auto check_closure = label_to_string(label++);
  auto lab_false = label_to_string(label++);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ASM::asmcode::RAX);
  code.add(ASM::asmcode::AND, ASM::asmcode::RBX, ASM::asmcode::NUMBER, procedure_mask);
  code.add(ASM::asmcode::CMP, ASM::asmcode::RBX, ASM::asmcode::NUMBER, procedure_tag);
  code.add(ASM::asmcode::JNES, check_closure);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, bool_t);
  code.add(ASM::asmcode::JMPS, done);
  code.add(ASM::asmcode::LABEL, check_closure);
  jump_short_if_arg_is_not_block(code, ASM::asmcode::RAX, ASM::asmcode::RBX, lab_false);
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  jump_short_if_arg_does_not_point_to_closure(code, ASM::asmcode::RAX, ASM::asmcode::RAX, lab_false);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, bool_t);
  code.add(ASM::asmcode::JMPS, done);
  code.add(ASM::asmcode::LABEL, lab_false);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, bool_f);
  code.add(ASM::asmcode::LABEL, done);
  }